

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL js_object_has_name(JSContext *ctx,JSValue obj)

{
  JSRuntime *pJVar1;
  uint uVar2;
  ulong uVar3;
  list_head *plVar4;
  
  pJVar1 = ctx->rt;
  uVar2 = *(uint *)((long)&(pJVar1->mf).js_malloc +
                   (long)(int)(~(uint)(pJVar1->malloc_state).malloc_count | 0xffffffc9) * 4);
  while( true ) {
    if (uVar2 == 0) {
      return 0;
    }
    uVar3 = (ulong)uVar2;
    if (*(int *)((long)&(pJVar1->malloc_state).opaque + uVar3 * 8 + 4) == 0x36) break;
    uVar2 = *(uint *)(&(pJVar1->malloc_state).opaque + uVar3) & 0x3ffffff;
  }
  uVar2 = 1;
  if ((*(uint *)(&(pJVar1->malloc_state).opaque + uVar3) < 0x40000000) &&
     (plVar4 = (ctx->link).prev + (uVar3 - 1), *(int *)&plVar4->next == -7)) {
    uVar2 = (uint)(((ulong)plVar4->prev->prev & 0x7fffffff00000000) != 0);
  }
  return uVar2;
}

Assistant:

static force_inline JSShapeProperty *find_own_property(JSProperty **ppr,
                                                       JSObject *p,
                                                       JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *prop;
    intptr_t h;
    sh = p->shape;
    h = (uintptr_t)atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h - 1];
    prop = get_shape_prop(sh);
    while (h) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            *ppr = &p->prop[h - 1];
            /* the compiler should be able to assume that pr != NULL here */
            return pr;
        }
        h = pr->hash_next;
    }
    *ppr = NULL;
    return NULL;
}